

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_service_multiface(t_cpp_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  t_struct *ptVar4;
  t_function *tfunction;
  t_cpp_generator *ptVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  pointer pptVar12;
  pointer pptVar13;
  string call;
  string list_type;
  string extends;
  string extends_multiface;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  t_cpp_generator *local_158;
  pointer local_150;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  char *local_e8;
  long local_e0;
  char local_d8 [16];
  string local_c8;
  vector<t_function_*,_std::allocator<t_function_*>_> local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_a8,&tservice->functions_);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_148,this,&tservice->extends_->super_t_type,false,false);
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_148);
    paVar3 = &local_148.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar3) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    std::operator+(&local_1b8,", public ",&local_128);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_148.field_2._M_allocated_capacity = *psVar11;
      local_148.field_2._8_8_ = plVar8[3];
      local_148._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar11;
      local_148._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_148._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar3) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  paVar3 = &local_198.field_2;
  local_198._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,"std::vector<std::shared_ptr<","");
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_198,
                              (ulong)(this->super_t_oop_generator).super_t_generator.service_name_.
                                     _M_dataplus._M_p);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1b8.field_2._M_allocated_capacity = *psVar11;
    local_1b8.field_2._8_8_ = plVar8[3];
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar11;
    local_1b8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1b8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_148.field_2._M_allocated_capacity = *psVar11;
    local_148.field_2._8_8_ = plVar8[3];
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar11;
    local_148._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_148._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  poVar1 = &this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"class ",6);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p
                      ,(this->super_t_oop_generator).super_t_generator.service_name_.
                       _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Multiface : ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"virtual public ",0xf);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"If",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_e8,local_e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," {",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Multiface(",10);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_148._M_dataplus._M_p,local_148._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"& ifaces) : ifaces_(ifaces) {",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if (local_128._M_string_length != 0) {
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::operator+(&local_178,"  std::vector<std::shared_ptr<",
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_198.field_2._M_allocated_capacity = *psVar11;
      local_198.field_2._8_8_ = plVar8[3];
      local_198._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar11;
      local_198._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_198._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_198._M_dataplus._M_p,local_198._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_108._M_dataplus._M_p,local_108._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  for (iter = ifaces.begin(); iter != ifaces.end(); ++iter) {",0x3d);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    ",4);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_128._M_dataplus._M_p,local_128._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Multiface::add(*iter);",0x16);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  }",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar3) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_198._M_dataplus._M_p,local_198._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"virtual ~",9);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Multiface() {}",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," protected:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_148._M_dataplus._M_p,local_148._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ifaces_;",9);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_198._M_dataplus._M_p,local_198._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Multiface() {}",0xe);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"void add(::std::shared_ptr<",0x1b);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"If> iface) {",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if (local_128._M_string_length != 0) {
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_128._M_dataplus._M_p,local_128._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Multiface::add(iface);",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ifaces_.push_back(iface);",0x1b);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_198._M_dataplus._M_p,local_198._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  pptVar13 = local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ptVar5 = this;
  if (local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_158 = ptVar5;
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
                (this,poVar1,*pptVar13);
      ptVar4 = (*pptVar13)->arglist_;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"ifaces_[i]->","");
      local_150 = pptVar13;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_178,(ulong)((*pptVar13)->name_)._M_dataplus._M_p);
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_198.field_2._M_allocated_capacity = *psVar11;
        local_198.field_2._8_8_ = puVar10[3];
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = *psVar11;
        local_198._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_198._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
      ptVar5 = local_158;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1b8.field_2._M_allocated_capacity = *psVar11;
        local_1b8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar11;
        local_1b8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1b8._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      pptVar13 = local_150;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      bVar6 = is_complex_type(ptVar5,(*pptVar13)->returntype_);
      bVar6 = !bVar6;
      if (!bVar6) {
        std::__cxx11::string::append((char *)&local_1b8);
      }
      for (pptVar12 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar12 !=
          (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
        if (bVar6) {
          bVar6 = false;
        }
        else {
          std::__cxx11::string::append((char *)&local_1b8);
        }
        std::__cxx11::string::_M_append
                  ((char *)&local_1b8,(ulong)((*pptVar12)->name_)._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)&local_1b8);
      paVar3 = &local_198.field_2;
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)local_158);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_198._M_dataplus._M_p,local_198._M_string_length);
      tfunction = *local_150;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
      function_signature(&local_178,local_158,tfunction,&local_c8,&local_90,true);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," override {",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      ptVar5 = local_158;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar3) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      piVar2 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)ptVar5);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_198._M_dataplus._M_p,local_198._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"size_t sz = ifaces_.size();",0x1b);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_178,(t_generator *)ptVar5);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"size_t i = 0;",0xd);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_108,(t_generator *)ptVar5);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_108._M_dataplus._M_p,local_108._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for (; i < (sz - 1); ++i) {",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar3) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      piVar2 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)ptVar5);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_198._M_dataplus._M_p,local_198._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar3) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      piVar2 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)ptVar5);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_198._M_dataplus._M_p,local_198._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar3) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      iVar7 = (*((*local_150)->returntype_->super_t_doc)._vptr_t_doc[4])();
      this = local_158;
      if ((char)iVar7 == '\0') {
        bVar6 = is_complex_type(local_158,(*local_150)->returntype_);
        this = local_158;
        if (bVar6) {
          t_generator::indent_abi_cxx11_(&local_198,(t_generator *)local_158);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,local_198._M_dataplus._M_p,
                              local_198._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return;",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
        }
        else {
          t_generator::indent_abi_cxx11_(&local_198,(t_generator *)local_158);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,local_198._M_dataplus._M_p,
                              local_198._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_198,(t_generator *)local_158);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,local_198._M_dataplus._M_p,local_198._M_string_length)
        ;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar3) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_198._M_dataplus._M_p,local_198._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar3) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      pptVar13 = local_150 + 1;
      ptVar5 = local_158;
    } while (local_150 + 1 !=
             local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"};",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_service_multiface(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_multiface = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_multiface = ", public " + extends + "Multiface";
  }

  string list_type = string("std::vector<std::shared_ptr<") + service_name_ + "If> >";

  // Generate the header portion
  f_header_ << "class " << service_name_ << "Multiface : "
            << "virtual public " << service_name_ << "If" << extends_multiface << " {" << endl
            << " public:" << endl;
  indent_up();
  f_header_ << indent() << service_name_ << "Multiface(" << list_type
            << "& ifaces) : ifaces_(ifaces) {" << endl;
  if (!extends.empty()) {
    f_header_ << indent()
              << "  std::vector<std::shared_ptr<" + service_name_ + "If> >::iterator iter;"
              << endl << indent() << "  for (iter = ifaces.begin(); iter != ifaces.end(); ++iter) {"
              << endl << indent() << "    " << extends << "Multiface::add(*iter);" << endl
              << indent() << "  }" << endl;
  }
  f_header_ << indent() << "}" << endl << indent() << "virtual ~" << service_name_
            << "Multiface() {}" << endl;
  indent_down();

  // Protected data members
  f_header_ << " protected:" << endl;
  indent_up();
  f_header_ << indent() << list_type << " ifaces_;" << endl << indent() << service_name_
            << "Multiface() {}" << endl << indent() << "void add(::std::shared_ptr<"
            << service_name_ << "If> iface) {" << endl;
  if (!extends.empty()) {
    f_header_ << indent() << "  " << extends << "Multiface::add(iface);" << endl;
  }
  f_header_ << indent() << "  ifaces_.push_back(iface);" << endl << indent() << "}" << endl;
  indent_down();

  f_header_ << indent() << " public:" << endl;
  indent_up();

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_header_, *f_iter);
    t_struct* arglist = (*f_iter)->get_arglist();
    const vector<t_field*>& args = arglist->get_members();
    vector<t_field*>::const_iterator a_iter;

    string call = string("ifaces_[i]->") + (*f_iter)->get_name() + "(";
    bool first = true;
    if (is_complex_type((*f_iter)->get_returntype())) {
      call += "_return";
      first = false;
    }
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      if (first) {
        first = false;
      } else {
        call += ", ";
      }
      call += (*a_iter)->get_name();
    }
    call += ")";

    f_header_ << indent() << function_signature(*f_iter, "") << " override {" << endl;
    indent_up();
    f_header_ << indent() << "size_t sz = ifaces_.size();" << endl << indent() << "size_t i = 0;"
              << endl << indent() << "for (; i < (sz - 1); ++i) {" << endl;
    indent_up();
    f_header_ << indent() << call << ";" << endl;
    indent_down();
    f_header_ << indent() << "}" << endl;

    if (!(*f_iter)->get_returntype()->is_void()) {
      if (is_complex_type((*f_iter)->get_returntype())) {
        f_header_ << indent() << call << ";" << endl << indent() << "return;" << endl;
      } else {
        f_header_ << indent() << "return " << call << ";" << endl;
      }
    } else {
      f_header_ << indent() << call << ";" << endl;
    }

    indent_down();
    f_header_ << indent() << "}" << endl << endl;
  }

  indent_down();
  f_header_ << indent() << "};" << endl << endl;
}